

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

SchnorrSignature *
cfd::core::SchnorrUtil::Sign
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          ByteData256 *aux_rand)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_38;
  
  ByteData256::GetData((ByteData *)&_Stack_38,aux_rand);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)0x0,
             (ByteData *)&_Stack_38);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_38);
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::Sign(
    const ByteData256 &msg, const Privkey &sk, const ByteData256 &aux_rand) {
  return SignCommon(msg, sk, nullptr, aux_rand.GetData());
}